

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void do_gpr_ld_memidx(DisasContext_conflict1 *s,TCGv_i64 dest,TCGv_i64 tcg_addr,int size,
                     _Bool is_signed,_Bool extend,int memidx,_Bool iss_valid,uint iss_srt,
                     _Bool iss_sf,_Bool iss_ar)

{
  TCGContext_conflict1 *tcg_ctx;
  MemOp memop;
  
  if (3 < size) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
               ,0x387,"size <= 3");
  }
  tcg_ctx = s->uc->tcg_ctx;
  memop = s->be_data + size + MO_ASHIFT;
  if (!is_signed) {
    memop = s->be_data + size;
  }
  tcg_gen_qemu_ld_i64_aarch64(tcg_ctx,dest,tcg_addr,(ulong)(uint)memidx,memop);
  if (extend && is_signed) {
    if (size == 3) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x390,"size < 3");
    }
    tcg_gen_ext32u_i64_aarch64(tcg_ctx,dest,dest);
  }
  if (iss_valid) {
    if (s->insn_start == (TCGOp *)0x0) {
      __assert_fail("s->insn_start != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.h"
                    ,0x8d,"void disas_set_insn_syndrome(DisasContext *, uint32_t)");
    }
    s->insn_start->args[2] =
         (ulong)(((uint)iss_ar << 0xe |
                 (uint)iss_sf << 0xf |
                 (iss_srt << 0x10 | (uint)is_signed << 0x15 | size << 0x16) & 0xffc000) >> 0xe |
                0xc00);
    s->insn_start = (TCGOp *)0x0;
  }
  return;
}

Assistant:

static void do_gpr_ld_memidx(DisasContext *s,
                             TCGv_i64 dest, TCGv_i64 tcg_addr,
                             int size, bool is_signed,
                             bool extend, int memidx,
                             bool iss_valid, unsigned int iss_srt,
                             bool iss_sf, bool iss_ar)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    MemOp memop = s->be_data + size;

    g_assert(size <= 3);

    if (is_signed) {
        memop += MO_SIGN;
    }

    tcg_gen_qemu_ld_i64(tcg_ctx, dest, tcg_addr, memidx, memop);

    if (extend && is_signed) {
        g_assert(size < 3);
        tcg_gen_ext32u_i64(tcg_ctx, dest, dest);
    }

    if (iss_valid) {
        uint32_t syn;

        syn = syn_data_abort_with_iss(0,
                                      size,
                                      is_signed,
                                      iss_srt,
                                      iss_sf,
                                      iss_ar,
                                      0, 0, 0, 0, 0, false);
        disas_set_insn_syndrome(s, syn);
    }
}